

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t canLzop(void)

{
  wchar_t wVar1;
  
  if (canLzop_tested == '\0') {
    canLzop_tested = '\x01';
    wVar1 = systemf("lzop -V %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canLzop_value = 1;
    }
  }
  return (uint)canLzop_value;
}

Assistant:

int
canLzop(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lzop -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}